

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O2

void HTS_Engine_save_label(HTS_Engine *engine,FILE *fp)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  ulong index;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  long local_68;
  
  sVar1 = HTS_ModelSet_get_nstate(&engine->ms);
  sVar2 = (engine->condition).fperiod;
  auVar9._8_4_ = (int)(sVar2 >> 0x20);
  auVar9._0_8_ = sVar2;
  auVar9._12_4_ = 0x45300000;
  sVar3 = (engine->condition).sampling_frequency;
  auVar10._8_4_ = (int)(sVar3 >> 0x20);
  auVar10._0_8_ = sVar3;
  auVar10._12_4_ = 0x45300000;
  dVar15 = (((auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) * 10000000.0) /
           ((auVar10._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
  lVar8 = 0;
  local_68 = 0;
  index = 0;
  while( true ) {
    sVar2 = HTS_Label_get_size(&engine->label);
    if (sVar2 <= index) break;
    lVar7 = 0;
    for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
      sVar3 = HTS_SStreamSet_get_duration(&engine->sss,lVar8 + sVar2);
      lVar7 = lVar7 + sVar3;
    }
    auVar11._8_4_ = (int)((ulong)local_68 >> 0x20);
    auVar11._0_8_ = local_68;
    auVar11._12_4_ = 0x45300000;
    dVar13 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0)) * dVar15;
    uVar4 = (ulong)dVar13;
    local_68 = local_68 + lVar7;
    auVar12._8_4_ = (int)((ulong)local_68 >> 0x20);
    auVar12._0_8_ = local_68;
    auVar12._12_4_ = 0x45300000;
    dVar14 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0)) * dVar15;
    uVar6 = (ulong)dVar14;
    pcVar5 = HTS_Label_get_string(&engine->label,index);
    fprintf((FILE *)fp,"%lu %lu %s\n",
            (long)(dVar13 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4,
            (long)(dVar14 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6,pcVar5);
    index = index + 1;
    lVar8 = lVar8 + sVar1;
  }
  return;
}

Assistant:

void HTS_Engine_save_label(HTS_Engine * engine, FILE * fp)
{
   size_t i, j;
   size_t frame, state, duration;

   HTS_Label *label = &engine->label;
   HTS_SStreamSet *sss = &engine->sss;
   size_t nstate = HTS_ModelSet_get_nstate(&engine->ms);
   double rate = engine->condition.fperiod * 1.0e+07 / engine->condition.sampling_frequency;

   for (i = 0, state = 0, frame = 0; i < HTS_Label_get_size(label); i++) {
      for (j = 0, duration = 0; j < nstate; j++)
         duration += HTS_SStreamSet_get_duration(sss, state++);
      fprintf(fp, "%lu %lu %s\n", (unsigned long) (frame * rate), (unsigned long) ((frame + duration) * rate), HTS_Label_get_string(label, i));
      frame += duration;
   }
}